

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O2

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  CURLcode CVar2;
  FILE *pFVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *__file;
  CURLcode CVar7;
  dynbuf local_118;
  uchar randbuf [41];
  stat sb;
  
  *tempname = (char *)0x0;
  pFVar3 = fopen64(filename,"w");
  *fh = (FILE *)pFVar3;
  CVar7 = CURLE_WRITE_ERROR;
  __file = (char *)0x0;
  if (pFVar3 != (FILE *)0x0) {
    iVar1 = fileno(pFVar3);
    iVar1 = fstat64(iVar1,(stat64 *)&sb);
    if (iVar1 == -1) {
      return CURLE_OK;
    }
    if ((sb.st_mode & 0xf000) != 0x8000) {
      return CURLE_OK;
    }
    fclose((FILE *)*fh);
    *fh = (FILE *)0x0;
    CVar2 = Curl_rand_alnum(data,randbuf,0x29);
    if (CVar2 == CURLE_OK) {
      Curl_dyn_init(&local_118,8000000);
      sVar4 = strlen(filename);
      if (sVar4 == 0) {
LAB_00126c13:
        sVar4 = 0;
      }
      else {
        do {
          sVar5 = sVar4;
          if (sVar5 == 0) break;
          sVar4 = sVar5 - 1;
        } while (filename[sVar5 - 1] != '/');
        do {
          sVar4 = sVar5;
          if (sVar4 == 0) goto LAB_00126c13;
          sVar5 = sVar4 - 1;
        } while (filename[sVar4 - 1] == '/');
      }
      CVar2 = Curl_dyn_addn(&local_118,filename,sVar4);
      if ((CVar2 == CURLE_OK) &&
         ((sVar4 == 0 || (CVar2 = Curl_dyn_addn(&local_118,"/",1), CVar2 == CURLE_OK)))) {
        pcVar6 = Curl_dyn_ptr(&local_118);
        if (pcVar6 != (char *)0x0) {
          __file = curl_maprintf("%s%s.tmp",pcVar6,randbuf);
          (*Curl_cfree)(pcVar6);
          if (__file != (char *)0x0) {
            iVar1 = open64(__file,0xc1,(ulong)(sb.st_mode | 0x180));
            if (iVar1 != -1) {
              pFVar3 = fdopen(iVar1,"w");
              *fh = (FILE *)pFVar3;
              if (pFVar3 != (FILE *)0x0) {
                *tempname = __file;
                return CURLE_OK;
              }
              close(iVar1);
              unlink(__file);
            }
            goto LAB_00126c30;
          }
        }
        __file = (char *)0x0;
        CVar7 = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar7 = CURLE_OUT_OF_MEMORY;
        __file = (char *)0x0;
      }
    }
    else {
      __file = (char *)0x0;
      CVar7 = CVar2;
    }
  }
LAB_00126c30:
  (*Curl_cfree)(__file);
  return CVar7;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randbuf[41];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  char *dir = NULL;
  *tempname = NULL;

  *fh = fopen(filename, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;
  if(
#ifdef UNDER_CE
     stat(filename, &sb) == -1
#else
     fstat(fileno(*fh), &sb) == -1
#endif
     || !S_ISREG(sb.st_mode)) {
    return CURLE_OK;
  }
  fclose(*fh);
  *fh = NULL;

  result = Curl_rand_alnum(data, randbuf, sizeof(randbuf));
  if(result)
    goto fail;

  dir = dirslash(filename);
  if(dir) {
    /* The temp filename should not end up too long for the target file
       system */
    tempstore = aprintf("%s%s.tmp", dir, randbuf);
    free(dir);
  }

  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
#if (defined(ANDROID) || defined(__ANDROID__)) && \
    (defined(__i386__) || defined(__arm__))
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, (mode_t)(0600|sb.st_mode));
#else
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600|sb.st_mode);
#endif
  if(fd == -1)
    goto fail;

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);
  return result;
}